

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MemPool.cpp
# Opt level: O0

void amrex_mempool_init(void)

{
  int iVar1;
  void *__s;
  void *p;
  size_t N;
  int i;
  int nthreads;
  ParmParse pp;
  unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_> *in_stack_ffffffffffffff18;
  ArenaInfo *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  ParmParse *this;
  size_type in_stack_ffffffffffffff38;
  vector<std::unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_>,_std::allocator<std::unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_>_>_>
  *in_stack_ffffffffffffff40;
  size_t __n;
  Long local_b8;
  ArenaInfo *__args_1;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 uVar2;
  int local_94;
  undefined1 local_79 [121];
  
  if (((anonymous_namespace)::initialized & 1) == 0) {
    (anonymous_namespace)::initialized = 1;
    this = (ParmParse *)local_79;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_79 + 1),"fab",(allocator *)this);
    amrex::ParmParse::ParmParse
              (this,(string *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    std::__cxx11::string::~string((string *)(local_79 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_79);
    amrex::ParmParse::queryAdd<int,_0>
              (this,(char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
               (int *)in_stack_ffffffffffffff20);
    iVar1 = amrex::OpenMP::get_max_threads();
    std::
    vector<std::unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_>,_std::allocator<std::unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_>_>_>
    ::resize(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    for (local_94 = 0; local_94 < iVar1; local_94 = local_94 + 1) {
      uVar2 = 0;
      local_b8 = 0;
      __args_1 = (ArenaInfo *)0x0;
      in_stack_ffffffffffffff20 = (ArenaInfo *)&local_b8;
      amrex::ArenaInfo::ArenaInfo(in_stack_ffffffffffffff20);
      amrex::ArenaInfo::SetCpuMemory(in_stack_ffffffffffffff20);
      std::make_unique<amrex::CArena,int,amrex::ArenaInfo&>
                ((int *)CONCAT44(uVar2,in_stack_ffffffffffffff58),__args_1);
      amrex::
      Vector<std::unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_>,_std::allocator<std::unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_>_>_>
      ::operator[]((Vector<std::unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_>,_std::allocator<std::unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_>_>_>
                    *)in_stack_ffffffffffffff20,(size_type)in_stack_ffffffffffffff18);
      std::unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_>::operator=
                ((unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_> *)
                 in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      std::unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_>::~unique_ptr
                ((unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_> *)
                 in_stack_ffffffffffffff20);
    }
    __n = 0x800000;
    __s = amrex_mempool_alloc((size_t)in_stack_ffffffffffffff20);
    memset(__s,0,__n);
    amrex_mempool_free(in_stack_ffffffffffffff20);
    amrex::ParmParse::~ParmParse((ParmParse *)0x104fa02);
  }
  return;
}

Assistant:

void amrex_mempool_init ()
{
    if (!initialized)
    {
        initialized = true;

        ParmParse pp("fab");
        pp.queryAdd("init_snan", init_snan);

        int nthreads = OpenMP::get_max_threads();

        the_memory_pool.resize(nthreads);
        for (int i=0; i<nthreads; ++i) {
            the_memory_pool[i] = std::make_unique<CArena>(0, ArenaInfo().SetCpuMemory());
        }

#ifdef AMREX_USE_OMP
#pragma omp parallel num_threads(nthreads)
#endif
        {
            size_t N = 1024*1024*sizeof(double);
            void *p = amrex_mempool_alloc(N);
            memset(p, 0, N);
            amrex_mempool_free(p);
        }

#ifdef AMREX_MEM_PROFILING
        MemProfiler::add("MemPool", std::function<MemProfiler::MemInfo()>
                         ([] () -> MemProfiler::MemInfo {
                             int MB_min, MB_max, MB_tot;
                             amrex_mempool_get_stats(MB_min, MB_max, MB_tot);
                             Long b = MB_tot * (1024L*1024L);
                             return {b, b};
                         }));
#endif
    }
}